

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_texture_op(CompilerMSL *this,Instruction *i,bool sparse)

{
  uint32_t result_type;
  uint32_t result_id;
  uint32_t id_00;
  uint32_t id_01;
  CompilerError *this_00;
  uint32_t *puVar1;
  SPIRType *pSVar2;
  undefined1 local_a0 [8];
  string expr;
  SPIRType *imgtype;
  SPIRType *type;
  uint32_t img;
  uint32_t id;
  uint32_t result_type_id;
  uint32_t *ops;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  Instruction *pIStack_18;
  bool sparse_local;
  Instruction *i_local;
  CompilerMSL *this_local;
  
  local_19 = sparse;
  pIStack_18 = i;
  i_local = (Instruction *)this;
  if (sparse) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,"Sparse feedback not yet supported in MSL.",&local_41);
    CompilerError::CompilerError(this_00,(string *)local_40);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (((this->msl_options).use_framebuffer_fetch_subpasses & 1U) != 0) {
    puVar1 = Compiler::stream((Compiler *)this,i);
    result_type = *puVar1;
    result_id = puVar1[1];
    id_00 = puVar1[2];
    pSVar2 = Compiler::expression_type((Compiler *)this,id_00);
    id_01 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).self);
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id_01);
    if ((pSVar2->image).dim == DimSubpassData) {
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_a0,(uint32_t)this,SUB41(id_00,0))
      ;
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,result_type,result_id,(string *)local_a0,true,false);
      ::std::__cxx11::string::~string((string *)local_a0);
      return;
    }
  }
  CompilerGLSL::emit_texture_op(&this->super_CompilerGLSL,pIStack_18,(bool)(local_19 & 1));
  return;
}

Assistant:

void CompilerMSL::emit_texture_op(const Instruction &i, bool sparse)
{
	if (sparse)
		SPIRV_CROSS_THROW("Sparse feedback not yet supported in MSL.");

	if (msl_options.use_framebuffer_fetch_subpasses)
	{
		auto *ops = stream(i);

		uint32_t result_type_id = ops[0];
		uint32_t id = ops[1];
		uint32_t img = ops[2];

		auto &type = expression_type(img);
		auto &imgtype = get<SPIRType>(type.self);

		// Use Metal's native frame-buffer fetch API for subpass inputs.
		if (imgtype.image.dim == DimSubpassData)
		{
			// Subpass inputs cannot be invalidated,
			// so just forward the expression directly.
			string expr = to_expression(img);
			emit_op(result_type_id, id, expr, true);
			return;
		}
	}

	// Fallback to default implementation
	CompilerGLSL::emit_texture_op(i, sparse);
}